

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O2

void __thiscall HMISong::HMISong(HMISong *this,FileReader *reader,EMidiDevice type,char *args)

{
  int *__s1;
  int iVar1;
  BYTE *pBVar2;
  undefined4 extraout_var;
  ulong uVar3;
  uint len;
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,type,args);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__HMISong_006ea7e8;
  this->MusHeader = (BYTE *)0x0;
  this->Tracks = (TrackInfo *)0x0;
  (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array = (AutoNoteOff *)0x0;
  (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Most = 0;
  (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count = 0;
  len = (uint)reader->Length;
  if (0xff < (int)len) {
    uVar3 = (ulong)(len & 0x7fffffff);
    pBVar2 = (BYTE *)operator_new__(uVar3);
    this->MusHeader = pBVar2;
    this->SongLen = len;
    this->NumTracks = 0;
    iVar1 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,pBVar2,uVar3);
    if (CONCAT44(extraout_var,iVar1) == uVar3) {
      __s1 = (int *)this->MusHeader;
      iVar1 = bcmp(__s1,"HMI-MIDISONG061595",0x13);
      if (iVar1 == 0) {
        SetupForHMI(this,len);
      }
      else if ((*__s1 == 0x4d494d48) && (__s1[1] == 0x50494449)) {
        SetupForHMP(this,len);
      }
    }
  }
  return;
}

Assistant:

HMISong::HMISong (FileReader &reader, EMidiDevice type, const char *args)
: MIDIStreamer(type, args), MusHeader(0), Tracks(0)
{
#ifdef _WIN32
	if (ExitEvent == NULL)
	{
		return;
	}
#endif
    int len = reader.GetLength();
	if (len < 0x100)
	{ // Way too small to be HMI.
		return;
	}
	MusHeader = new BYTE[len];
	SongLen = len;
	NumTracks = 0;
	if (reader.Read(MusHeader, len) != len)
		return;

	// Do some validation of the MIDI file
	if (memcmp(MusHeader, HMI_SONG_MAGIC, sizeof(HMI_SONG_MAGIC)) == 0)
	{
		SetupForHMI(len);
	}
	else if (((DWORD *)MusHeader)[0] == MAKE_ID('H','M','I','M') &&
			 ((DWORD *)MusHeader)[1] == MAKE_ID('I','D','I','P'))
	{
		SetupForHMP(len);
	}
}